

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterYs<unsigned_long_long> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  GetterYRef *pGVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  ImDrawIdx IVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  pIVar17 = GImPlot;
  pGVar11 = this->Getter1;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar11->Ys +
           (long)(((prim + pGVar11->Offset) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride);
  dVar24 = log10((pGVar11->XScale * (double)prim + pGVar11->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar13 = pIVar17->CurrentPlot;
  dVar4 = (pIVar13->XAxis).Range.Min;
  dVar5 = (pIVar13->XAxis).Range.Max;
  dVar25 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar17->CurrentPlot;
  dVar6 = pIVar13->YAxis[iVar8].Range.Min;
  fVar26 = (float)((((double)(float)(dVar24 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar13->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar8].Min.x);
  fVar21 = (float)((((double)(float)(dVar25 / pIVar17->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar17->My[iVar8] + (double)pIVar17->PixelRange[iVar8].Min.y);
  pGVar14 = this->Getter2;
  pTVar12 = this->Transformer;
  dVar3 = pGVar14->YRef;
  dVar24 = log10(((double)prim * pGVar14->XScale + pGVar14->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar4 = pIVar18->LogDenX;
  pIVar13 = pIVar18->CurrentPlot;
  dVar5 = (pIVar13->XAxis).Range.Min;
  dVar6 = (pIVar13->XAxis).Range.Max;
  dVar25 = log10(dVar3 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar18->CurrentPlot;
  dVar3 = pIVar13->YAxis[iVar8].Range.Min;
  fVar27 = (float)((((double)(float)(dVar24 / dVar4) * (dVar6 - dVar5) + dVar5) -
                   (pIVar13->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar8].Min.x);
  fVar28 = (float)((((double)(float)(dVar25 / pIVar18->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar18->My[iVar8] + (double)pIVar18->PixelRange[iVar8].Min.y);
  fVar22 = fVar21;
  if (fVar28 <= fVar21) {
    fVar22 = fVar28;
  }
  bVar20 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar28 <= fVar21) & (uint)fVar28 |
                      -(uint)(fVar28 <= fVar21) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar26;
    if (fVar27 <= fVar26) {
      fVar22 = fVar27;
    }
    bVar20 = false;
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar27 <= fVar26) & (uint)fVar27 |
                      -(uint)(fVar27 <= fVar26) & (uint)fVar26);
      bVar20 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar20 != false) {
    fVar22 = this->Weight;
    IVar9 = this->Col;
    IVar7 = *uv;
    fVar29 = fVar27 - fVar26;
    fVar30 = fVar28 - fVar21;
    fVar23 = fVar29 * fVar29 + fVar30 * fVar30;
    if (0.0 < fVar23) {
      if (fVar23 < 0.0) {
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar29 = fVar29 * (1.0 / fVar23);
      fVar30 = fVar30 * (1.0 / fVar23);
    }
    fVar22 = fVar22 * 0.5;
    fVar29 = fVar29 * fVar22;
    fVar22 = fVar22 * fVar30;
    pIVar15 = DrawList->_VtxWritePtr;
    (pIVar15->pos).x = fVar22 + fVar26;
    (pIVar15->pos).y = fVar21 - fVar29;
    pIVar15->uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = IVar9;
    pIVar15[1].pos.x = fVar22 + fVar27;
    pIVar15[1].pos.y = fVar28 - fVar29;
    pIVar15[1].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = IVar9;
    pIVar15[2].pos.x = fVar27 - fVar22;
    pIVar15[2].pos.y = fVar29 + fVar28;
    pIVar15[2].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = IVar9;
    pIVar15[3].pos.x = fVar26 - fVar22;
    pIVar15[3].pos.y = fVar29 + fVar21;
    pIVar15[3].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar15 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar10;
    *pIVar16 = IVar19;
    pIVar16[1] = IVar19 + 1;
    pIVar16[2] = IVar19 + 2;
    pIVar16[3] = IVar19;
    pIVar16[4] = IVar19 + 2;
    pIVar16[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }